

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     ::format_custom_arg<Date>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  basic_parse_context<char,_fmt::v5::internal::error_handler> *this;
  iterator it;
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  *in_RSI;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_00000008;
  formatter<fmt::v5::basic_string_view<char>,_char,_void> *in_stack_00000010;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  type f;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *in_stack_000001f8;
  Date *in_stack_00000200;
  formatter<Date,_char,_void> *in_stack_00000208;
  iterator in_stack_ffffffffffffff98;
  
  formatter<Date,_char,_void>::formatter((formatter<Date,_char,_void> *)0x16f558);
  this = context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
         ::parse_context(in_RSI);
  formatter<fmt::v5::basic_string_view<char>,char,void>::
  parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
            (in_stack_00000010,in_stack_00000008);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            (this,in_stack_ffffffffffffff98);
  it = formatter<Date,char,void>::
       format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                 (in_stack_00000208,in_stack_00000200,in_stack_000001f8);
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::advance_to(in_RSI,it);
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }